

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_426d84::ReferenceType::printLeft(ReferenceType *this,OutputStream *s)

{
  char *pcVar1;
  bool bVar2;
  pair<(anonymous_namespace)::ReferenceKind,_const_(anonymous_namespace)::Node_*> pVar3;
  StringView local_68;
  StringView local_58;
  StringView local_48;
  ReferenceKind local_38;
  pair<(anonymous_namespace)::ReferenceKind,_const_(anonymous_namespace)::Node_*> Collapsed;
  SwapAndRestore<bool> SavePrinting;
  OutputStream *s_local;
  ReferenceType *this_local;
  
  if ((this->Printing & 1U) == 0) {
    SwapAndRestore<bool>::SwapAndRestore
              ((SwapAndRestore<bool> *)&Collapsed.second,&this->Printing,true);
    pVar3 = collapse(this,s);
    Collapsed._0_8_ = pVar3.second;
    local_38 = pVar3.first;
    (*((Node *)Collapsed._0_8_)->_vptr_Node[4])(Collapsed._0_8_,s);
    bVar2 = Node::hasArray((Node *)Collapsed._0_8_,s);
    if (bVar2) {
      StringView::StringView(&local_48," ");
      OutputStream::operator+=(s,local_48);
    }
    bVar2 = Node::hasArray((Node *)Collapsed._0_8_,s);
    if ((bVar2) || (bVar2 = Node::hasFunction((Node *)Collapsed._0_8_,s), bVar2)) {
      StringView::StringView(&local_58,"(");
      OutputStream::operator+=(s,local_58);
    }
    pcVar1 = " &&";
    if (local_38 == LValue) {
      pcVar1 = " &";
    }
    StringView::StringView(&local_68,pcVar1 + 1);
    OutputStream::operator+=(s,local_68);
    SwapAndRestore<bool>::~SwapAndRestore((SwapAndRestore<bool> *)&Collapsed.second);
  }
  return;
}

Assistant:

void printLeft(OutputStream &s) const override {
    if (Printing)
      return;
    SwapAndRestore<bool> SavePrinting(Printing, true);
    std::pair<ReferenceKind, const Node *> Collapsed = collapse(s);
    Collapsed.second->printLeft(s);
    if (Collapsed.second->hasArray(s))
      s += " ";
    if (Collapsed.second->hasArray(s) || Collapsed.second->hasFunction(s))
      s += "(";

    s += (Collapsed.first == ReferenceKind::LValue ? "&" : "&&");
  }